

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O1

void __thiscall arm::ConstValue::display(ConstValue *this,ostream *o)

{
  undefined1 *puVar1;
  char cVar2;
  int iVar3;
  int *piVar4;
  ostream *poVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  char *pcVar10;
  bool bVar11;
  
  puVar1 = &this->field_0x8;
  cVar2 = this->field_0x28;
  if (cVar2 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>(o,"\t.word ",7);
    std::ostream::_M_insert<unsigned_long>((ulong)o);
    return;
  }
  if (cVar2 == '\x01') {
    piVar4 = *(int **)puVar1;
    iVar6 = 1;
    cVar2 = (char)o;
    if (4 < (ulong)(*(long *)&this->field_0x10 - (long)piVar4)) {
      bVar11 = true;
      uVar8 = 1;
      iVar9 = *piVar4;
      do {
        iVar3 = piVar4[uVar8];
        if (bVar11) {
          if (iVar3 == iVar9) {
            iVar6 = iVar6 + 1;
          }
          else {
            std::ios::widen((char)*(undefined8 *)(*(long *)o + -0x18) + cVar2);
            std::ostream::put(cVar2);
            poVar5 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t.word ",7);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          }
          bVar11 = false;
        }
        else if (iVar3 == iVar9) {
          iVar6 = iVar6 + 1;
        }
        else if (iVar6 < 2) {
          std::__ostream_insert<char,std::char_traits<char>>(o,", ",2);
          std::ostream::_M_insert<unsigned_long>((ulong)o);
        }
        else {
          std::ios::widen((char)*(undefined8 *)(*(long *)o + -0x18) + cVar2);
          std::ostream::put(cVar2);
          poVar5 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t.fill ",7);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", 4, ",5);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          iVar6 = 1;
          bVar11 = true;
        }
        uVar8 = uVar8 + 1;
        piVar4 = *(int **)puVar1;
        iVar9 = iVar3;
      } while (uVar8 < (ulong)(*(long *)&this->field_0x10 - (long)piVar4 >> 2));
    }
    if (iVar6 < 2) {
      pcVar10 = ", ";
      lVar7 = 2;
      poVar5 = o;
    }
    else {
      std::ios::widen((char)*(undefined8 *)(*(long *)o + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(o,"\t.fill ",7);
      poVar5 = (ostream *)std::ostream::operator<<(o,iVar6);
      pcVar10 = ", 4, ";
      lVar7 = 5;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar10,lVar7);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if (((this->len).super__Optional_base<int,_true,_true>._M_payload.
         super__Optional_payload_base<int>._M_engaged == true) &&
       ((ulong)(*(long *)&this->field_0x10 - *(long *)puVar1 >> 2) <
        (ulong)(long)(this->len).super__Optional_base<int,_true,_true>._M_payload.
                     super__Optional_payload_base<int>._M_payload._M_value)) {
      std::__ostream_insert<char,std::char_traits<char>>(o,"\t.fill ",7);
      if ((this->len).super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged != false) {
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)o);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", 4, ",5);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        return;
      }
      std::__throw_bad_optional_access();
    }
  }
  else if (cVar2 == '\x02') {
    if (this->ty == Word) {
      std::__ostream_insert<char,std::char_traits<char>>(o,"\t.word ",7);
      pcVar10 = *(char **)puVar1;
      lVar7 = *(long *)&this->field_0x10;
    }
    else {
      if (this->ty != AsciZ) {
        return;
      }
      std::__ostream_insert<char,std::char_traits<char>>(o,"\t.asciz \"",9);
      o = std::__ostream_insert<char,std::char_traits<char>>
                    (o,*(char **)puVar1,*(long *)&this->field_0x10);
      pcVar10 = "\"";
      lVar7 = 1;
    }
    std::__ostream_insert<char,std::char_traits<char>>(o,pcVar10,lVar7);
    return;
  }
  return;
}

Assistant:

void ConstValue::display(std::ostream &o) const {
  if (auto x = std::get_if<uint32_t>(this)) {
    o << "\t.word " << *x;
  } else if (auto x = std::get_if<std::vector<uint32_t>>(this)) {
    uint32_t last = x->front();
    int repeat_count = 1;
    bool newline = true;
    for (int i = 1; i < x->size(); i++) {
      uint32_t new_item = (*x)[i];
      if (newline) {
        if (new_item == last) {
          repeat_count++;
        } else {
          o << std::endl << "\t.word " << last;
        }
        newline = false;
      } else {
        if (new_item == last) {
          repeat_count++;
        } else {
          if (repeat_count > 1) {
            o << std::endl << "\t.fill " << repeat_count << ", 4, " << last;
            newline = true;
            repeat_count = 1;
          } else {
            o << ", " << last;
          }
        }
      }
      last = new_item;
    }
    if (repeat_count > 1) {
      o << std::endl;
      o << "\t.fill " << repeat_count << ", 4, " << last << std::endl;
      newline = true;
      repeat_count = 1;
    } else {
      o << ", " << last << std::endl;
    }
    if (len && x->size() < len.value()) {
      o << "\t.fill " << (len.value() - x->size()) << ", 4, " << last
        << std::endl;
    }
  } else if (auto x = std::get_if<std::string>(this)) {
    if (ty == ConstType::AsciZ)
      o << "\t.asciz \"" << *x << "\"";
    else if (ty == ConstType::Word)
      o << "\t.word " << *x;
  }
}